

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O2

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
_set_selector<Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,4>>
          (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *this,
          GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>
          *other,true_type *param_2)

{
  void *local_20 [2];
  
  Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,4>>
            ((Matrix<double,_1,1,0,_1,1> *)local_20,
             (MatrixBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>_>
              *)other);
  lazyAssign<Eigen::Matrix<double,_1,1,0,_1,1>>
            (this,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_20);
  free(local_20[0]);
  return;
}

Assistant:

EIGEN_STRONG_INLINE void _set_selector(const OtherDerived& other, const internal::true_type&) { _set_noalias(other.eval()); }